

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O0

void __thiscall
OpenMesh::
AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
::AttribKernelT(AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_fffffffffffffec8;
  int _idx;
  PolyConnectivity *in_stack_fffffffffffffed0;
  allocator *paVar1;
  string *in_stack_fffffffffffffee0;
  allocator *_name;
  VPropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  *in_stack_fffffffffffffee8;
  EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  *_ph;
  BaseKernel *in_stack_fffffffffffffef0;
  allocator *this_00;
  VPropHandleT<OpenMesh::VectorT<float,_3>_> *in_stack_fffffffffffffef8;
  BaseKernel *in_stack_ffffffffffffff00;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  PolyConnectivity::PolyConnectivity(in_stack_fffffffffffffed0);
  *in_RDI = &PTR__AttribKernelT_0027ed90;
  _idx = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  VPropHandleT<OpenMesh::VectorT<float,_3>_>::VPropHandleT
            ((VPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<OpenMesh::VectorT<float,_3>_>::VPropHandleT
            ((VPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::VPropHandleT
            ((VPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<float>::VPropHandleT((VPropHandleT<float> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<OpenMesh::VectorT<float,_2>_>::VPropHandleT
            ((VPropHandleT<OpenMesh::VectorT<float,_2>_> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<OpenMesh::VectorT<float,_3>_>::VPropHandleT
            ((VPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<float>::HPropHandleT((HPropHandleT<float> *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<OpenMesh::VectorT<float,_2>_>::HPropHandleT
            ((HPropHandleT<OpenMesh::VectorT<float,_2>_> *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<OpenMesh::VectorT<float,_3>_>::HPropHandleT
            ((HPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<OpenMesh::VectorT<float,_3>_>::HPropHandleT
            ((HPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::HPropHandleT
            ((HPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> *)in_stack_fffffffffffffed0,_idx);
  EPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::EPropHandleT
            ((EPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> *)in_stack_fffffffffffffed0,_idx);
  FPropHandleT<OpenMesh::VectorT<float,_3>_>::FPropHandleT
            ((FPropHandleT<OpenMesh::VectorT<float,_3>_> *)in_stack_fffffffffffffed0,_idx);
  FPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::FPropHandleT
            ((FPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> *)in_stack_fffffffffffffed0,_idx);
  FPropHandleT<int>::FPropHandleT((FPropHandleT<int> *)in_stack_fffffffffffffed0,_idx);
  VPropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  ::VPropHandleT((VPropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
                  *)in_stack_fffffffffffffed0,_idx);
  HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  ::HPropHandleT((HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
                  *)in_stack_fffffffffffffed0,_idx);
  EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  ::EPropHandleT((EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
                  *)in_stack_fffffffffffffed0,_idx);
  FPropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  ::FPropHandleT((FPropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
                  *)in_stack_fffffffffffffed0,_idx);
  *(undefined4 *)((long)in_RDI + 0x1ec) = 0;
  *(undefined4 *)(in_RDI + 0x3e) = 0;
  *(undefined4 *)((long)in_RDI + 500) = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  *(undefined4 *)((long)in_RDI + 0x1fc) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)((long)in_RDI + 0x204) = 0;
  *(undefined4 *)(in_RDI + 0x41) = 0;
  *(undefined4 *)((long)in_RDI + 0x20c) = 0;
  *(undefined4 *)(in_RDI + 0x42) = 0;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  *(undefined4 *)((long)in_RDI + 0x21c) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"v:points",&local_39);
  BaseKernel::add_property<OpenMesh::VectorT<float,3>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(string *)in_stack_fffffffffffffef0
            );
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  paVar1 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"<vprop>",paVar1);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  _ph = (EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
         *)(in_RDI + 0x3d);
  this_00 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"<fprop>",this_00);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this_00,
             (FPropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
              *)_ph,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  _name = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"<hprop>",_name);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this_00,
             (HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
              *)_ph,(string *)_name);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  paVar1 = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"<eprop>",paVar1);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this_00,_ph,(string *)_name);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return;
}

Assistant:

AttribKernelT()
  : refcount_vnormals_(0),
    refcount_vcolors_(0),
    refcount_vtexcoords1D_(0),
    refcount_vtexcoords2D_(0),
    refcount_vtexcoords3D_(0),
    refcount_htexcoords1D_(0),
    refcount_htexcoords2D_(0),
    refcount_htexcoords3D_(0),
    refcount_henormals_(0),
    refcount_hecolors_(0),
    refcount_ecolors_(0),
    refcount_fnormals_(0),
    refcount_fcolors_(0),
    refcount_ftextureIndex_(0)
  {
    this->add_property( points_, "v:points" );

    if (VAttribs & Attributes::Normal)
      request_vertex_normals();

    if (VAttribs & Attributes::Color)
      request_vertex_colors();

    if (VAttribs & Attributes::TexCoord1D)
      request_vertex_texcoords1D();

    if (VAttribs & Attributes::TexCoord2D)
      request_vertex_texcoords2D();

    if (VAttribs & Attributes::TexCoord3D)
      request_vertex_texcoords3D();

    if (HAttribs & Attributes::TexCoord1D)
      request_halfedge_texcoords1D();

    if (HAttribs & Attributes::TexCoord2D)
      request_halfedge_texcoords2D();

    if (HAttribs & Attributes::TexCoord3D)
      request_halfedge_texcoords3D();

    if (HAttribs & Attributes::Color)
      request_halfedge_colors();

    if (VAttribs & Attributes::Status)
      Connectivity::request_vertex_status();

    if (HAttribs & Attributes::Status)
      Connectivity::request_halfedge_status();

    if (HAttribs & Attributes::Normal)
      request_halfedge_normals();

    if (EAttribs & Attributes::Status)
      Connectivity::request_edge_status();
    
    if (EAttribs & Attributes::Color)
      request_edge_colors();

    if (FAttribs & Attributes::Normal)
      request_face_normals();

    if (FAttribs & Attributes::Color)
      request_face_colors();

    if (FAttribs & Attributes::Status)
      Connectivity::request_face_status();

    if (FAttribs & Attributes::TextureIndex)
      request_face_texture_index();

    //FIXME: data properties might actually cost storage even
    //if there are no data traits??
    this->add_property(data_vpph_);
    this->add_property(data_fpph_);
    this->add_property(data_hpph_);
    this->add_property(data_epph_);
  }